

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::testSSBODraw
          (FunctionalTest12 *this,GLuint subroutine_index,GLuint *expected_results)

{
  ostringstream *this_00;
  undefined1 auVar1 [16];
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined1 (*value) [16];
  MessageBuilder *pMVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  GLuint subroutine_index_local;
  undefined1 local_1b0 [384];
  long lVar4;
  
  subroutine_index_local = subroutine_index;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1668))(0x8b30,1,&subroutine_index_local);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1972);
  (**(code **)(lVar4 + 0x538))(0,0,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1976);
  value = (undefined1 (*) [16])(**(code **)(lVar4 + 0xcf8))(0x90d2,35000);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x197a);
  auVar1 = *value;
  auVar7[0] = -((char)*expected_results == auVar1[0]);
  auVar7[1] = -(*(char *)((long)expected_results + 1) == auVar1[1]);
  auVar7[2] = -(*(char *)((long)expected_results + 2) == auVar1[2]);
  auVar7[3] = -(*(char *)((long)expected_results + 3) == auVar1[3]);
  auVar7[4] = -((char)expected_results[1] == auVar1[4]);
  auVar7[5] = -(*(char *)((long)expected_results + 5) == auVar1[5]);
  auVar7[6] = -(*(char *)((long)expected_results + 6) == auVar1[6]);
  auVar7[7] = -(*(char *)((long)expected_results + 7) == auVar1[7]);
  auVar7[8] = -((char)expected_results[2] == auVar1[8]);
  auVar7[9] = -(*(char *)((long)expected_results + 9) == auVar1[9]);
  auVar7[10] = -(*(char *)((long)expected_results + 10) == auVar1[10]);
  auVar7[0xb] = -(*(char *)((long)expected_results + 0xb) == auVar1[0xb]);
  auVar7[0xc] = -((char)expected_results[3] == auVar1[0xc]);
  auVar7[0xd] = -(*(char *)((long)expected_results + 0xd) == auVar1[0xd]);
  auVar7[0xe] = -(*(char *)((long)expected_results + 0xe) == auVar1[0xe]);
  auVar7[0xf] = -(*(char *)((long)expected_results + 0xf) == auVar1[0xf]);
  bVar6 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf
                  ) != 0xffff;
  if (bVar6) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Error. Invalid result. ");
    std::operator<<((ostream *)this_00,"Result: [ ");
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(uint *)value);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)(*value + 4));
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)(*value + 8));
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)(*value + 0xc));
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ] ");
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    "Expected: [ ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,expected_results);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,expected_results + 1);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,expected_results + 2);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,expected_results + 3);
    std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ]");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  (**(code **)(lVar4 + 0x1670))(0x90d2);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x198b);
  return !bVar6;
}

Assistant:

bool FunctionalTest12::testSSBODraw(GLuint subroutine_index, const GLuint expected_results[4]) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &subroutine_index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Draw */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Capture results */
	GLuint* ssbo_results = (GLuint*)gl.mapBuffer(GL_SHADER_STORAGE_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	/* Verify */
	bool result = (0 == memcmp(expected_results, ssbo_results, 4 * sizeof(GLuint)));

	if (false == result)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result. "
											<< "Result: [ " << ssbo_results[0] << ", " << ssbo_results[1] << ", "
											<< ssbo_results[2] << ", " << ssbo_results[3] << " ] "
											<< "Expected: [ " << expected_results[0] << ", " << expected_results[1]
											<< ", " << expected_results[2] << ", " << expected_results[3] << " ]"
											<< tcu::TestLog::EndMessage;
	}

	/* Unmap buffer */
	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Done */
	return result;
}